

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_space.cpp
# Opt level: O0

ssize_t __thiscall Memory_space::write(Memory_space *this,int __fd,void *__buf,size_t __n)

{
  unsigned_long *puVar1;
  uint8_t *puVar2;
  ulong local_50;
  unsigned_long local_48;
  size_t nbytes;
  uint8_t *data_ptr;
  size_t data_size;
  uint byte_offset;
  uint page_index;
  size_t size_local;
  uint8_t *data_local;
  Memory_space *pMStack_10;
  uint32_t address_local;
  Memory_space *this_local;
  
  data_size._4_4_ = (uint)__fd >> ((byte)this->page_bits & 0x1f) & this->page_table_mask;
  data_size._0_4_ = __fd & this->page_mask;
  nbytes = (size_t)__buf;
  _byte_offset = __n;
  size_local = (size_t)__buf;
  data_local._4_4_ = __fd;
  pMStack_10 = this;
  for (data_ptr = (uint8_t *)__n; data_ptr != (uint8_t *)0x0; data_ptr = data_ptr + -local_48) {
    local_50 = (ulong)(this->page_size - (uint)data_size);
    puVar1 = std::min<unsigned_long>((unsigned_long *)&data_ptr,&local_50);
    local_48 = *puVar1;
    if ((undefined1  [16])
        ((undefined1  [16])this->page_table[data_size._4_4_] & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      puVar2 = (uint8_t *)calloc((ulong)this->page_size,1);
      this->page_table[data_size._4_4_].data = puVar2;
      *(byte *)(this->page_table + data_size._4_4_) =
           *(byte *)(this->page_table + data_size._4_4_) & 0xfe | 1;
    }
    memcpy(this->page_table[data_size._4_4_].data + (uint)data_size,(void *)nbytes,local_48);
    nbytes = local_48 + nbytes;
    data_size._4_4_ = data_size._4_4_ + 1 & this->page_table_mask;
    __buf = (void *)(ulong)data_size._4_4_;
    data_size._0_4_ = 0;
  }
  return (ssize_t)__buf;
}

Assistant:

void Memory_space::write(uint32_t address, uint8_t *data, size_t size)
{
	unsigned page_index = (address >> page_bits) & page_table_mask;
	unsigned byte_offset = address & page_mask;
	size_t data_size = size;
	uint8_t *data_ptr = data;
	while ( data_size > 0 ) {
		size_t nbytes = min(data_size, (size_t)(page_size - byte_offset));
		if (!page_table[page_index].present) {
			page_table[page_index].data = (uint8_t*)calloc(page_size, 1);
			page_table[page_index].present = 1;
		}
		memcpy(page_table[page_index].data + byte_offset, data_ptr, nbytes);
		data_size -= nbytes;
		data_ptr += nbytes;
		page_index = (page_index + 1) & page_table_mask;
		byte_offset = 0;
	}
}